

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DistWeightSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DistWeightSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  DistWeightSyntax *pDVar11;
  
  pDVar11 = (DistWeightSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DistWeightSyntax *)this->endPtr < pDVar11 + 1) {
    pDVar11 = (DistWeightSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pDVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pDVar11->super_SyntaxNode).kind = DistWeight;
  (pDVar11->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pDVar11->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pDVar11->op).kind = TVar3;
  (pDVar11->op).field_0x2 = uVar4;
  (pDVar11->op).numFlags = (NumericTokenFlags)NVar5.raw;
  (pDVar11->op).rawLen = uVar6;
  (pDVar11->op).info = pIVar1;
  (pDVar11->extraOp).kind = TVar7;
  (pDVar11->extraOp).field_0x2 = uVar8;
  (pDVar11->extraOp).numFlags = (NumericTokenFlags)NVar9.raw;
  (pDVar11->extraOp).rawLen = uVar10;
  (pDVar11->extraOp).info = pIVar2;
  (pDVar11->expr).ptr = args_2;
  (args_2->super_SyntaxNode).parent = &pDVar11->super_SyntaxNode;
  return pDVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }